

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# twopass_encoder.c
# Opt level: O1

int encode_frame(aom_codec_ctx_t *ctx,aom_image_t *img,aom_codec_pts_t pts,uint duration,
                aom_enc_frame_flags_t flags,AvxVideoWriter *writer)

{
  uint uVar1;
  aom_codec_err_t aVar2;
  int iVar3;
  aom_codec_cx_pkt_t *paVar4;
  undefined4 in_register_0000000c;
  char *pcVar5;
  aom_codec_iter_t iter;
  aom_codec_iter_t local_38;
  
  local_38 = (aom_codec_iter_t)0x0;
  iVar3 = 0;
  aVar2 = aom_codec_encode(ctx,img,pts,1,0);
  if (aVar2 != AOM_CODEC_OK) {
    pcVar5 = "Failed to encode frame.";
LAB_0011eae9:
    die_codec(ctx,pcVar5);
  }
  paVar4 = aom_codec_get_cx_data(ctx,&local_38);
  if (paVar4 != (aom_codec_cx_pkt_t *)0x0) {
    do {
      if (paVar4->kind == AOM_CODEC_CX_FRAME_PKT) {
        uVar1 = (paVar4->data).frame.flags;
        iVar3 = aom_video_writer_write_frame
                          ((AvxVideoWriter *)CONCAT44(in_register_0000000c,duration),
                           (uint8_t *)(paVar4->data).frame.buf,(paVar4->data).frame.sz,
                           (paVar4->data).frame.pts);
        if (iVar3 == 0) {
          pcVar5 = "Failed to write compressed frame.";
          goto LAB_0011eae9;
        }
        pcVar5 = "K";
        if ((uVar1 & 1) == 0) {
          pcVar5 = ".";
        }
        printf(pcVar5);
        fflush(_stdout);
      }
      paVar4 = aom_codec_get_cx_data(ctx,&local_38);
    } while (paVar4 != (aom_codec_cx_pkt_t *)0x0);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

static int encode_frame(aom_codec_ctx_t *ctx, const aom_image_t *img,
                        aom_codec_pts_t pts, unsigned int duration,
                        aom_enc_frame_flags_t flags, AvxVideoWriter *writer) {
  int got_pkts = 0;
  aom_codec_iter_t iter = NULL;
  const aom_codec_cx_pkt_t *pkt = NULL;
  const aom_codec_err_t res = aom_codec_encode(ctx, img, pts, duration, flags);
  if (res != AOM_CODEC_OK) die_codec(ctx, "Failed to encode frame.");

  while ((pkt = aom_codec_get_cx_data(ctx, &iter)) != NULL) {
    got_pkts = 1;
    if (pkt->kind == AOM_CODEC_CX_FRAME_PKT) {
      const int keyframe = (pkt->data.frame.flags & AOM_FRAME_IS_KEY) != 0;

      if (!aom_video_writer_write_frame(writer, pkt->data.frame.buf,
                                        pkt->data.frame.sz,
                                        pkt->data.frame.pts))
        die_codec(ctx, "Failed to write compressed frame.");
      printf(keyframe ? "K" : ".");
      fflush(stdout);
    }
  }

  return got_pkts;
}